

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

bool __thiscall
glu::VariableDeclaration::operator==(VariableDeclaration *this,VariableDeclaration *other)

{
  bool bVar1;
  __type_conflict _Var2;
  
  bVar1 = Layout::operator==(&this->layout,&other->layout);
  if (((bVar1) && (this->interpolation == other->interpolation)) &&
     (this->storage == other->storage)) {
    bVar1 = glu::VarType::operator==(&this->varType,&other->varType);
    if ((bVar1) && (this->memoryAccessQualifierBits == other->memoryAccessQualifierBits)) {
      _Var2 = std::operator==(&this->name,&other->name);
      return _Var2;
    }
  }
  return false;
}

Assistant:

bool VariableDeclaration::operator== (const VariableDeclaration& other) const
{
	return	layout == other.layout &&
			interpolation == other.interpolation &&
			storage == other.storage &&
			varType == other.varType &&
			memoryAccessQualifierBits == other.memoryAccessQualifierBits &&
			name == other.name;
}